

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O2

Status __thiscall
flatbuffers::anon_unknown_0::NimBfbsGenerator::GenerateFromSchema
          (NimBfbsGenerator *this,Schema *schema,CodeGenOptions *options)

{
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *pVVar1;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *pVVar2;
  uint8_t *offset_location;
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *pVVar3;
  uint8_t *offset_location_1;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *pVVar4;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  std::__cxx11::string::_M_assign((string *)&this->options_);
  pVVar1 = reflection::Schema::enums(schema);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(const_reflection::Enum_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/bfbs_gen_nim.cpp:102:34)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(const_reflection::Enum_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/bfbs_gen_nim.cpp:102:34)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  for (pVVar3 = pVVar1 + 4; pVVar3 != pVVar1 + 4 + (uint)(*(int *)pVVar1 << 2); pVVar3 = pVVar3 + 4)
  {
    std::function<void_(const_reflection::Enum_*)>::operator()
              ((function<void_(const_reflection::Enum_*)> *)&local_50,
               (Enum *)(pVVar3 + *(uint *)pVVar3));
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  pVVar2 = reflection::Schema::objects(schema);
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<void_(const_reflection::Object_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/bfbs_gen_nim.cpp:106:38)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(const_reflection::Object_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/bfbs_gen_nim.cpp:106:38)>
             ::_M_manager;
  local_70._M_unused._M_object = this;
  for (pVVar4 = pVVar2 + 4; pVVar4 != pVVar2 + 4 + (uint)(*(int *)pVVar2 << 2); pVVar4 = pVVar4 + 4)
  {
    std::function<void_(const_reflection::Object_*)>::operator()
              ((function<void_(const_reflection::Object_*)> *)&local_70,
               (Object *)(pVVar4 + *(uint *)pVVar4));
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  return OK;
}

Assistant:

Status GenerateFromSchema(const r::Schema *schema,
                            const CodeGenOptions &options)
      FLATBUFFERS_OVERRIDE {
    options_ = options;
    ForAllEnums(schema->enums(), [&](const r::Enum *enum_def) {
      StartCodeBlock(enum_def);
      GenerateEnum(enum_def);
    });
    ForAllObjects(schema->objects(), [&](const r::Object *object) {
      StartCodeBlock(object);
      GenerateObject(object);
    });
    return OK;
  }